

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_metadata.cpp
# Opt level: O2

bool __thiscall duckdb::ArrowSchemaMetadata::HasExtension(ArrowSchemaMetadata *this)

{
  string arrow_extension;
  allocator local_51;
  string local_50;
  string local_30;
  
  ::std::__cxx11::string::string((string *)&local_50,"ARROW:extension:name",&local_51);
  GetOption(&local_30,this,&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_30);
  return local_30._M_string_length != 0;
}

Assistant:

bool ArrowSchemaMetadata::HasExtension() const {
	auto arrow_extension = GetOption(ArrowSchemaMetadata::ARROW_EXTENSION_NAME);
	return !arrow_extension.empty();
}